

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscPStackEntry.cpp
# Opt level: O0

void __thiscall CNscPStackEntry::CNscPStackEntry(CNscPStackEntry *this)

{
  long in_RDI;
  
  CNwnDoubleLinkList::CNwnDoubleLinkList((CNwnDoubleLinkList *)0x209958);
  *(undefined8 *)(in_RDI + 0x18) = 0;
  *(long *)(in_RDI + 0x70) = in_RDI + 0x88;
  *(undefined8 *)(in_RDI + 0x80) = 0x400;
  *(long *)(in_RDI + 0x20) = in_RDI + 0x30;
  *(undefined8 *)(in_RDI + 0x28) = 0x40;
  return;
}

Assistant:

CNscPStackEntry::CNscPStackEntry ()
{

	//
	// Initialize our 1 time init variables
	//

	m_pFence = NULL;
	m_pauchData = m_auchDataFast;
	m_nDataAlloc = _countof (m_auchDataFast);
	m_pszId = m_achIdFast;
	m_nIdAlloc = _countof (m_achIdFast);
}